

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

Float __thiscall
pbrt::ConductorBxDF::PDF
          (ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  int iVar1;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  Float FVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  float __x;
  undefined1 auVar6 [16];
  float in_XMM2_Dd;
  undefined1 auVar7 [16];
  Tuple3<pbrt::Vector3,_float> local_38;
  Tuple3<pbrt::Vector3,_float> local_28;
  
  local_28.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._8_56_ = wo._8_56_;
  auVar5._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_28._0_8_ = vmovlps_avx(auVar5._0_16_);
  fVar3 = 0.0;
  if (((sampleFlags & Reflection) != Unset) &&
     (0.0 < local_28.z * wi.super_Tuple3<pbrt::Vector3,_float>.z)) {
    auVar4 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                        ZEXT416((uint)(this->mfDistrib).alpha_x));
    fVar3 = 0.0;
    if (0.001 <= auVar4._0_4_) {
      auVar4._0_4_ = local_28.x + wi.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar4._4_4_ = local_28.y + wi.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar4._8_4_ = 0;
      auVar4._12_4_ = in_XMM2_Dd + 0.0;
      local_38.z = local_28.z + wi.super_Tuple3<pbrt::Vector3,_float>.z;
      local_38._0_8_ = vmovlps_avx(auVar4);
      if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
          ::reg == '\0') {
        iVar1 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg,CONCAT44(in_register_00000034,mode));
        if (iVar1 != 0) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
      }
      *(long *)(in_FS_OFFSET + -0x30) = *(long *)(in_FS_OFFSET + -0x30) + 1;
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(local_38.y * local_38.y)),ZEXT416((uint)local_38.x),
                               ZEXT416((uint)local_38.x));
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_38.z),ZEXT416((uint)local_38.z),auVar4);
      if ((auVar4._0_4_ == 0.0) && (!NAN(auVar4._0_4_))) {
        *(long *)(in_FS_OFFSET + -0x38) = *(long *)(in_FS_OFFSET + -0x38) + 1;
      }
      if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
          ::reg == '\0') {
        iVar1 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg);
        if (iVar1 != 0) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,const::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
      }
      *(long *)(in_FS_OFFSET + -0x20) = *(long *)(in_FS_OFFSET + -0x20) + 1;
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(local_38.y * local_28.y)),ZEXT416((uint)local_38.x),
                               ZEXT416((uint)local_28.x));
      auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)local_38.z),ZEXT416((uint)local_28.z));
      fVar3 = 0.0;
      if (auVar4._0_4_ < 0.0) {
        *(long *)(in_FS_OFFSET + -0x28) = *(long *)(in_FS_OFFSET + -0x28) + 1;
      }
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_38.x),ZEXT416((uint)local_38.x),
                               ZEXT416((uint)(local_38.y * local_38.y)));
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_38.z),ZEXT416((uint)local_38.z),auVar6);
      __x = auVar6._0_4_;
      if (((__x != 0.0) || (NAN(__x))) && (0.0 < auVar4._0_4_)) {
        if (__x < 0.0) {
          fVar3 = sqrtf(__x);
        }
        else {
          auVar4 = vsqrtss_avx(auVar6,auVar6);
          fVar3 = auVar4._0_4_;
        }
        auVar6._8_8_ = 0;
        auVar6._0_4_ = local_38.x;
        auVar6._4_4_ = local_38.y;
        auVar7._4_4_ = fVar3;
        auVar7._0_4_ = fVar3;
        auVar7._8_4_ = fVar3;
        auVar7._12_4_ = fVar3;
        auVar4 = vdivps_avx(auVar6,auVar7);
        local_38.z = local_38.z / fVar3;
        local_38._0_8_ = vmovlps_avx(auVar4);
        FVar2 = TrowbridgeReitzDistribution::PDF
                          (&this->mfDistrib,(Vector3f *)&local_28,(Vector3f *)&local_38);
        auVar4 = vfmadd231ss_fma(ZEXT416((uint)(local_28.y * local_38.y)),ZEXT416((uint)local_28.x),
                                 ZEXT416((uint)local_38.x));
        auVar4 = vfmadd132ss_fma(ZEXT416((uint)local_28.z),auVar4,ZEXT416((uint)local_38.z));
        fVar3 = FVar2 / (auVar4._0_4_ * 4.0);
      }
    }
  }
  return fVar3;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return 0;
        if (!SameHemisphere(wo, wi))
            return 0;
        if (mfDistrib.EffectivelySpecular())
            return 0;
        Vector3f wh = wo + wi;
        CHECK_RARE(1e-6, LengthSquared(wh) == 0);
        CHECK_RARE(1e-6, Dot(wo, wh) < 0);
        if (LengthSquared(wh) == 0 || Dot(wo, wh) <= 0)
            return 0;
        wh = Normalize(wh);
        return mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh));
    }